

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int libssh2_session_banner_set(LIBSSH2_SESSION *session,char *banner)

{
  int iVar1;
  size_t __n;
  uchar *puVar2;
  
  if (banner == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(banner);
  }
  puVar2 = (session->local).banner;
  if (puVar2 != (uchar *)0x0) {
    (*session->free)(puVar2,&session->abstract);
    (session->local).banner = (uchar *)0x0;
  }
  if (__n != 0) {
    puVar2 = (uchar *)(*session->alloc)(__n + 3,&session->abstract);
    (session->local).banner = puVar2;
    if (puVar2 == (uchar *)0x0) {
      iVar1 = _libssh2_error(session,-6,"Unable to allocate memory for local banner");
      return iVar1;
    }
    memcpy(puVar2,banner,__n);
    (session->local).banner[__n] = '\0';
    (session->local).banner[__n] = '\r';
    (session->local).banner[__n + 1] = '\n';
    (session->local).banner[__n + 2] = '\0';
  }
  return 0;
}

Assistant:

LIBSSH2_API int
libssh2_session_banner_set(LIBSSH2_SESSION * session, const char *banner)
{
    size_t banner_len = banner ? strlen(banner) : 0;

    if(session->local.banner) {
        LIBSSH2_FREE(session, session->local.banner);
        session->local.banner = NULL;
    }

    if(!banner_len)
        return 0;

    session->local.banner = LIBSSH2_ALLOC(session, banner_len + 3);
    if(!session->local.banner) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for local banner");
    }

    memcpy(session->local.banner, banner, banner_len);

    /* first zero terminate like this so that the debug output is nice */
    session->local.banner[banner_len] = '\0';
    _libssh2_debug((session, LIBSSH2_TRACE_TRANS, "Setting local Banner: %s",
                   session->local.banner));
    session->local.banner[banner_len++] = '\r';
    session->local.banner[banner_len++] = '\n';
    session->local.banner[banner_len] = '\0';

    return 0;
}